

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

UBool __thiscall
icu_63::CollationBuilder::ignoreString
          (CollationBuilder *this,UnicodeString *s,UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t cVar2;
  bool bVar3;
  
  UVar1 = isFCD(this,s,errorCode);
  if (UVar1 == '\0') {
    bVar3 = true;
  }
  else {
    cVar2 = UnicodeString::doCharAt(s,0);
    bVar3 = (ushort)cVar2 - 0xac00 < 0x2ba4;
  }
  return bVar3;
}

Assistant:

UBool
CollationBuilder::ignoreString(const UnicodeString &s, UErrorCode &errorCode) const {
    // Do not map non-FCD strings.
    // Do not map strings that start with Hangul syllables: We decompose those on the fly.
    return !isFCD(s, errorCode) || Hangul::isHangul(s.charAt(0));
}